

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<448>,Blob<224>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<224> B;
  Blob<224> A;
  Blob<448> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_b8;
  uint32_t local_b4;
  int *in_stack_ffffffffffffff50;
  int iVar3;
  undefined4 in_stack_ffffffffffffff5c;
  Rand *in_stack_ffffffffffffff60;
  Blob<224> local_88;
  Blob<448> local_6c;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0x38;
  local_2c = 0x1c;
  local_30 = 0x1c0;
  local_34 = 0xe0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<448>::Blob(&local_6c);
  Blob<224>::Blob(&local_88);
  Blob<224>::Blob((Blob<224> *)&stack0xffffffffffffff5c);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffff60,(void *)CONCAT44(in_stack_ffffffffffffff5c,iVar3),
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    (*local_8)(&local_6c,0x38,0,&local_88);
    in_stack_ffffffffffffff50 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_b4 = 0; (int)local_b4 < 0x1c0; local_b4 = local_b4 + 1) {
      flipbit(&local_6c,0x38,local_b4);
      (*local_8)(&local_6c,0x38,0,&stack0xffffffffffffff5c);
      flipbit(&local_6c,0x38,local_b4);
      for (local_b8 = 0; (int)local_b8 < 0xe0; local_b8 = local_b8 + 1) {
        uVar1 = getbit(&local_88,0x1c,local_b8);
        uVar2 = getbit(&stack0xffffffffffffff5c,0x1c,local_b8);
        *in_stack_ffffffffffffff50 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff50;
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}